

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_RecalculateAttachedLights(sector_t *sector)

{
  extsector_t *peVar1;
  uint uVar2;
  sector_t **ppsVar3;
  uint local_1c;
  uint i;
  xfloor *x;
  sector_t *sector_local;
  
  peVar1 = sector->e;
  local_1c = 0;
  while( true ) {
    uVar2 = TArray<sector_t_*,_sector_t_*>::Size(&(peVar1->XFloor).attached);
    if (uVar2 <= local_1c) break;
    ppsVar3 = TArray<sector_t_*,_sector_t_*>::operator[](&(peVar1->XFloor).attached,(ulong)local_1c)
    ;
    P_RecalculateLights(*ppsVar3);
    local_1c = local_1c + 1;
  }
  P_RecalculateLights(sector);
  return;
}

Assistant:

void P_RecalculateAttachedLights(sector_t *sector)
{
	extsector_t::xfloor &x = sector->e->XFloor;

	for(unsigned int i=0; i<x.attached.Size(); i++)
	{
		P_RecalculateLights(x.attached[i]);
	}
	P_RecalculateLights(sector);
}